

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

string * flatbuffers::IntToStringHex<unsigned_char>(string *__return_storage_ptr__,uchar i)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [383];
  uchar local_11;
  string *psStack_10;
  uchar i_local;
  
  local_11 = i;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  _Var2 = std::setw(2);
  poVar3 = std::operator<<(local_190,_Var2);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::uppercase);
  std::operator<<(poVar3,local_11);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string IntToStringHex(T i) {
  std::stringstream ss;
  ss << std::setw(sizeof(T) * 2)
     << std::setfill('0')
     << std::hex
     << std::uppercase
     << i;
  return ss.str();
}